

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::dumpValue(Dumper *this,Slice slice,Slice *base)

{
  bool bVar1;
  ValueType VVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  uint8_t *puVar7;
  Exception *this_00;
  undefined8 uVar8;
  byte bVar9;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  Dumper *in_RDX;
  Options *in_RSI;
  Slice SVar10;
  long *in_RDI;
  double __value;
  ObjectPair OVar11;
  uint8_t x;
  uint8_t value;
  ValueLength i;
  uint8_t *bin;
  ValueLength len_1;
  Slice external;
  char *p;
  ValueLength len;
  double v;
  ObjectPair current_2;
  ObjectPair current_1;
  ObjectPair current;
  ObjectIterator it_1;
  ArrayIterator it;
  uint64_t in_stack_fffffffffffffe58;
  Dumper *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  Slice in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Slice in_stack_fffffffffffffe80;
  ObjectIterator *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  byte bVar12;
  char *in_stack_fffffffffffffec8;
  ulong uVar13;
  Dumper *in_stack_fffffffffffffed0;
  ulong local_128;
  Slice local_110;
  Dumper *in_stack_fffffffffffffef8;
  Slice in_stack_ffffffffffffff00;
  Slice local_c8;
  Slice local_a8;
  Slice local_88;
  ObjectIterator local_78;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  Options *local_40;
  Slice *in_stack_ffffffffffffffe0;
  Slice slice_00;
  Options *local_8;
  
  slice_00._start = (uint8_t *)in_RDI;
  local_8 = in_RSI;
  if (((*(byte *)(*in_RDI + 0x2b) & 1) != 0) &&
     (bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isTagged
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         0x11f572), bVar1)) {
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getFirstTag
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               in_stack_fffffffffffffe70._start);
    appendUInt(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x3a);
  }
  VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     in_stack_fffffffffffffe60);
  switch(VVar2) {
  case None:
  case Illegal:
  case MinKey:
  case MaxKey:
    handleUnsupportedType(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    break;
  case Null:
    (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],"null",4);
    break;
  case Bool:
    bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBool
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       in_stack_fffffffffffffe60);
    if (bVar1) {
      (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],"true",4);
    }
    else {
      (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],"false",5);
    }
    break;
  case Array:
    local_40 = local_8;
    ArrayIterator::ArrayIterator
              ((ArrayIterator *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe70);
    SVar10._start = (uint8_t *)0x5b;
    (**(code **)(*(long *)in_RDI[1] + 0x10))();
    if ((*(byte *)(*in_RDI + 0x1a) & 1) == 0) {
      if ((*(byte *)(*in_RDI + 0x1b) & 1) == 0) {
        while (bVar1 = ArrayIterator::valid((ArrayIterator *)&stack0xffffffffffffffc8), bVar1) {
          pcVar5 = ArrayIterator::index
                             ((ArrayIterator *)&stack0xffffffffffffffc8,(char *)SVar10._start,__c_01
                             );
          if (pcVar5 != (char *)0x0) {
            (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x2c);
          }
          SVar10 = ArrayIterator::value
                             ((ArrayIterator *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          local_58 = SVar10._start;
          dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
          ArrayIterator::next((ArrayIterator *)in_stack_fffffffffffffe70._start);
        }
      }
      else {
        while (bVar1 = ArrayIterator::valid((ArrayIterator *)&stack0xffffffffffffffc8), bVar1) {
          pcVar5 = ArrayIterator::index
                             ((ArrayIterator *)&stack0xffffffffffffffc8,(char *)SVar10._start,__c_00
                             );
          if (pcVar5 != (char *)0x0) {
            (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x2c);
            (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x20);
          }
          SVar10 = ArrayIterator::value
                             ((ArrayIterator *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          local_50 = SVar10._start;
          dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
          ArrayIterator::next((ArrayIterator *)in_stack_fffffffffffffe70._start);
        }
      }
    }
    else {
      (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],10);
      *(int *)(in_RDI + 2) = (int)in_RDI[2] + 1;
      while (bVar1 = ArrayIterator::valid((ArrayIterator *)&stack0xffffffffffffffc8), bVar1) {
        indent((Dumper *)in_stack_fffffffffffffe70._start);
        SVar10 = ArrayIterator::value
                           ((ArrayIterator *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        local_48 = SVar10._start;
        dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
        pcVar5 = ArrayIterator::index
                           ((ArrayIterator *)&stack0xffffffffffffffc8,(char *)SVar10._start,__c);
        pcVar5 = pcVar5 + 1;
        pcVar6 = (char *)ArrayIterator::size((ArrayIterator *)&stack0xffffffffffffffc8);
        if (pcVar5 != pcVar6) {
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x2c);
        }
        (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],10);
        ArrayIterator::next((ArrayIterator *)in_stack_fffffffffffffe70._start);
      }
      *(int *)(in_RDI + 2) = (int)in_RDI[2] + -1;
      indent((Dumper *)in_stack_fffffffffffffe70._start);
    }
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x5d);
    break;
  case Object:
    ObjectIterator::ObjectIterator
              ((ObjectIterator *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe70,SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
    local_c8._start = (uint8_t *)0x7b;
    (**(code **)(*(long *)in_RDI[1] + 0x10))();
    if ((*(byte *)(*in_RDI + 0x1a) & 1) == 0) {
      local_a8._start = local_c8._start;
      if ((*(byte *)(*in_RDI + 0x1b) & 1) == 0) {
        while (bVar1 = ObjectIterator::valid(&local_78), bVar1) {
          pcVar5 = ObjectIterator::index(&local_78,(char *)local_c8._start,__c_04);
          if (pcVar5 != (char *)0x0) {
            (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x2c);
          }
          OVar11 = ObjectIterator::operator*(in_stack_fffffffffffffe90);
          dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x3a);
          local_c8 = OVar11.value._start;
          dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
          ObjectIterator::next(in_stack_fffffffffffffe90);
        }
      }
      else {
        while (bVar1 = ObjectIterator::valid(&local_78), bVar1) {
          pcVar5 = ObjectIterator::index(&local_78,(char *)local_a8._start,__c_03);
          if (pcVar5 != (char *)0x0) {
            (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x2c);
            (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x20);
          }
          OVar11 = ObjectIterator::operator*(in_stack_fffffffffffffe90);
          dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x3a);
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x20);
          local_a8 = OVar11.value._start;
          dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
          ObjectIterator::next(in_stack_fffffffffffffe90);
        }
      }
    }
    else {
      (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],10);
      *(int *)(in_RDI + 2) = (int)in_RDI[2] + 1;
      while (bVar1 = ObjectIterator::valid(&local_78), bVar1) {
        OVar11 = ObjectIterator::operator*(in_stack_fffffffffffffe90);
        indent((Dumper *)in_stack_fffffffffffffe70._start);
        dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
        (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1]," : ",3);
        local_88 = OVar11.value._start;
        dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
        pcVar5 = ObjectIterator::index(&local_78,(char *)local_88._start,__c_02);
        pcVar6 = (char *)ObjectIterator::size(&local_78);
        if (pcVar5 + 1 != pcVar6) {
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x2c);
        }
        (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],10);
        ObjectIterator::next(in_stack_fffffffffffffe90);
      }
      *(int *)(in_RDI + 2) = (int)in_RDI[2] + -1;
      indent((Dumper *)in_stack_fffffffffffffe70._start);
    }
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x7d);
    break;
  case Double:
    __value = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getDouble
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         in_stack_fffffffffffffe70._start);
    uVar4 = std::isnan(__value);
    if (((uVar4 & 1) == 0) && (uVar4 = std::isinf(__value), (uVar4 & 1) == 0)) {
      appendDouble((Dumper *)
                   CONCAT17(in_stack_fffffffffffffec7,
                            CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                   in_stack_fffffffffffffeb8);
    }
    else {
      if ((*(byte *)(*in_RDI + 0x24) & 1) != 0) {
        uVar4 = std::isnan(__value);
        if ((uVar4 & 1) != 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],"\"NaN\"",5);
          return;
        }
        uVar4 = std::isinf(__value);
        if ((uVar4 & 1) != 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x22);
          if ((__value == -INFINITY) && (!NAN(__value))) {
            (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x2d);
          }
          (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],"Infinity\"",9);
          return;
        }
      }
      handleUnsupportedType(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    }
    break;
  case UTCDate:
    if ((*(byte *)(*in_RDI + 0x26) & 1) == 0) {
      handleUnsupportedType(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    }
    else {
      SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUTCDate
                ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                 in_stack_fffffffffffffe70._start);
      appendInt(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    break;
  case External:
    if (in_RDX == (Dumper *)0x0) {
      in_RDX = (Dumper *)&stack0xfffffffffffffff8;
    }
    puVar7 = (uint8_t *)
             SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getExternal
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        in_stack_fffffffffffffe60);
    Slice::Slice(&local_110,puVar7);
    dumpValue(in_RDX,slice_00,in_stack_ffffffffffffffe0);
    break;
  case Int:
  case UInt:
  case SmallInt:
    dumpInteger((Dumper *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                in_stack_fffffffffffffe80);
    break;
  case String:
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               in_stack_fffffffffffffe70._start,
               (ValueLength *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],in_stack_ffffffffffffff00._start + 2)
    ;
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x22);
    dumpString(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x22);
    break;
  case Binary:
    if ((*(byte *)(*in_RDI + 0x25) & 1) == 0) {
      handleUnsupportedType(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    }
    else {
      (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x22);
      puVar7 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBinary
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                          in_stack_fffffffffffffe70._start);
      for (uVar13 = 0; uVar13 < local_128; uVar13 = uVar13 + 1) {
        bVar12 = puVar7[uVar13];
        bVar9 = bVar12 / 0x10;
        if (bVar9 < 10) {
          cVar3 = bVar9 + 0x30;
        }
        else {
          cVar3 = bVar9 + 0x57;
        }
        (**(code **)(*(long *)in_RDI[1] + 0x10))
                  ((long *)in_RDI[1],(int)cVar3,(ulong)bVar12 % 0x10,cVar3);
        bVar9 = (byte)((ulong)bVar12 % 0x10);
        if (bVar9 < 10) {
          cVar3 = bVar9 + 0x30;
        }
        else {
          cVar3 = bVar9 + 0x57;
        }
        (**(code **)(*(long *)in_RDI[1] + 0x10))
                  ((long *)in_RDI[1],(int)cVar3,(ulong)bVar12 % 0x10,cVar3);
      }
      (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x22);
    }
    break;
  case BCD:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,(ExceptionType)(in_stack_fffffffffffffe58 >> 0x20));
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case Custom:
    if (*(long *)(*in_RDI + 0x10) == 0) {
      uVar8 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_fffffffffffffe60,(ExceptionType)((ulong)uVar8 >> 0x20));
      __cxa_throw(uVar8,&Exception::typeinfo,Exception::~Exception);
    }
    if (in_RDX == (Dumper *)0x0) {
      in_RDX = (Dumper *)&stack0xfffffffffffffff8;
    }
    (**(code **)(**(long **)(*in_RDI + 0x10) + 0x10))
              (*(long **)(*in_RDI + 0x10),&stack0xfffffffffffffff8,in_RDI,in_RDX);
    break;
  case Tagged:
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::value
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    dump((Dumper *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
         in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void Dumper::dumpValue(Slice slice, Slice const* base) {
  if (options->debugTags && slice.isTagged()) {
    appendUInt(slice.getFirstTag());
    _sink->push_back(':');
  }

  switch (slice.type()) {
    case ValueType::Null: {
      _sink->append("null", 4);
      break;
    }

    case ValueType::Bool: {
      if (slice.getBool()) {
        _sink->append("true", 4);
      } else {
        _sink->append("false", 5);
      }
      break;
    }

    case ValueType::Array: {
      ArrayIterator it(slice);
      _sink->push_back('[');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          indent();
          dumpValue(it.value(), &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      }
      _sink->push_back(']');
      break;
    }

    case ValueType::Object: {
      ObjectIterator it(slice, !options->dumpAttributesInIndexOrder);
      _sink->push_back('{');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          auto current = (*it);
          indent();
          dumpValue(current.key, &slice);
          _sink->append(" : ", 3);
          dumpValue(current.value, &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          _sink->push_back(' ');
          dumpValue(current.value, &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          dumpValue(current.value, &slice);
          it.next();
        }
      }
      _sink->push_back('}');
      break;
    }

    case ValueType::Double: {
      double const v = slice.getDouble();

      if (!std::isnan(v) && !std::isinf(v)) {
        appendDouble(v);
        break;
      }

      if (options->unsupportedDoublesAsString) {
        if (std::isnan(v)) {
          _sink->append("\"NaN\"", 5);
          break;
        } else if (std::isinf(v)) {
          _sink->push_back('"');
          if (v == -INFINITY) {
            _sink->push_back('-');
          }
          _sink->append("Infinity\"", 9);
          break;
        }
      }

      handleUnsupportedType(slice);
      break;
    }

    case ValueType::Int:
    case ValueType::UInt:
    case ValueType::SmallInt: {
      dumpInteger(slice);
      break;
    }

    case ValueType::String: {
      ValueLength len;
      char const* p = slice.getString(len);
      _sink->reserve(2 + len);
      _sink->push_back('"');
      dumpString(p, len);
      _sink->push_back('"');
      break;
    }

    case ValueType::External: {
      if (base == nullptr) {
        base = &slice;
      }

      Slice external(reinterpret_cast<uint8_t const*>(slice.getExternal()));
      dumpValue(external, base);
      break;
    }

    case ValueType::Tagged: {
      dump(slice.value());
      break;
    }

    case ValueType::Binary: {
      if (options->binaryAsHex) {
        _sink->push_back('"');
        ValueLength len;
        uint8_t const* bin = slice.getBinary(len);
        for (ValueLength i = 0; i < len; ++i) {
          uint8_t value = bin[i];
          uint8_t x = value / 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
          x = value % 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
        }
        _sink->push_back('"');
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::UTCDate: {
      if (options->datesAsIntegers) {
        appendInt(slice.getUTCDate());
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::None:
    case ValueType::Illegal:
    case ValueType::MinKey:
    case ValueType::MaxKey: {
      handleUnsupportedType(slice);
      break;
    }

    case ValueType::BCD: {
      // TODO
      throw Exception(Exception::NotImplemented);
    }

    case ValueType::Custom: {
      if (options->customTypeHandler == nullptr) {
        throw Exception(Exception::NeedCustomTypeHandler);
      }
      if (base == nullptr) {
        base = &slice;
      }
      options->customTypeHandler->dump(slice, this, *base);
      break;
    }
  }
}